

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DivideOperator,bool>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  uint64_t uVar1;
  uhugeint_t right;
  bool bVar2;
  uint64_t *puVar3;
  idx_t iVar4;
  undefined8 *puVar5;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  uhugeint_t uVar6;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  uhugeint_t rentry_1;
  uhugeint_t lentry_1;
  idx_t i_1;
  uhugeint_t rentry;
  uhugeint_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  ulong in_stack_fffffffffffffee8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef8;
  long lVar7;
  ValidityMask *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  uint64_t in_stack_ffffffffffffff18;
  uint64_t in_stack_ffffffffffffff20;
  uhugeint_t in_stack_ffffffffffffff28;
  idx_t in_stack_ffffffffffffff50;
  uint64_t idx;
  ulong local_a8;
  uint64_t local_80;
  uint64_t local_78;
  ulong local_40;
  
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar2) && (bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar2))
  {
    for (local_a8 = 0; local_a8 < in_R9; local_a8 = local_a8 + 1) {
      lVar7 = in_RDI;
      iVar4 = SelectionVector::get_index(in_RCX,local_a8);
      puVar3 = (uint64_t *)(lVar7 + iVar4 * 0x10);
      uVar1 = *puVar3;
      idx = puVar3[1];
      iVar4 = SelectionVector::get_index(in_R8,local_a8);
      puVar5 = (undefined8 *)(in_RSI + iVar4 * 0x10);
      uVar6.upper = idx;
      uVar6.lower = uVar1;
      in_stack_ffffffffffffff28 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                     (SUB81((ulong)puVar5[1] >> 0x38,0),in_stack_ffffffffffffff28,uVar6,
                      (ValidityMask *)*puVar5,idx);
      puVar3 = (uint64_t *)(in_RDX + local_a8 * 0x10);
      *puVar3 = in_stack_ffffffffffffff28.lower;
      puVar3[1] = in_stack_ffffffffffffff28.upper;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffef8,(idx_t)in_stack_fffffffffffffef0);
      if ((bVar2) &&
         (bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_fffffffffffffef8,(idx_t)in_stack_fffffffffffffef0), bVar2)) {
        right.upper = in_stack_ffffffffffffff20;
        right.lower = in_stack_ffffffffffffff18;
        in_stack_fffffffffffffee8 = local_40;
        uVar6 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                          (SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
                           in_stack_ffffffffffffff28,right,in_stack_ffffffffffffff08,
                           in_stack_ffffffffffffff50);
        puVar3 = (uint64_t *)(in_RDX + local_40 * 0x10);
        local_80 = uVar6.lower;
        *puVar3 = local_80;
        local_78 = uVar6.upper;
        puVar3[1] = local_78;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}